

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

void rf_draw_model_ex(rf_model model,rf_vec3 position,rf_vec3 rotation_axis,float rotationAngle,
                     rf_vec3 scale,rf_color tint)

{
  rf_color rVar1;
  char cVar2;
  short sVar6;
  short sVar7;
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  undefined1 auVar10 [13];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  rf_mat left;
  undefined1 auVar13 [56];
  rf_mat left_00;
  rf_mesh mesh;
  rf_mat right;
  rf_mat right_00;
  rf_mat right_01;
  rf_material material;
  rf_mat transform;
  unkuint9 Var14;
  undefined1 auVar15 [11];
  undefined1 auVar16 [14];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  uint6 uVar19;
  long lVar20;
  rf_mesh *prVar21;
  rf_material *prVar22;
  undefined8 *puVar23;
  rf_int i;
  long lVar24;
  byte bVar25;
  int iVar26;
  int iVar29;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  short sVar30;
  int iVar31;
  rf_color rVar33;
  int iVar37;
  ushort uVar38;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 in_stack_fffffffffffffd58 [136];
  undefined8 local_1d8;
  double dStack_1d0;
  double local_1c8;
  double dStack_1c0;
  rf_mat result_1;
  rf_mat mat_scale;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  rf_mat mat_transform;
  rf_mat mat_rotation;
  char cVar3;
  char cVar4;
  char cVar5;
  undefined4 uVar32;
  undefined6 uVar34;
  
  bVar25 = 0;
  rf_mat_rotate(&mat_rotation,rotation_axis,rotationAngle * 0.017453292);
  local_1d8._4_4_ = position.y;
  auVar13 = ZEXT4456(CONCAT440(scale.z,ZEXT2440(CONCAT816((ulong)(uint)scale.y << 0x20,
                                                          ZEXT416((uint)scale.x)))));
  left.m11 = 0.0;
  left.m15 = 1.0;
  left.m0 = (float)auVar13._0_4_;
  left.m4 = (float)auVar13._4_4_;
  left.m8 = (float)auVar13._8_4_;
  left.m12 = (float)auVar13._12_4_;
  left.m1 = (float)auVar13._16_4_;
  left.m5 = (float)auVar13._20_4_;
  left.m9 = (float)auVar13._24_4_;
  left.m13 = (float)auVar13._28_4_;
  left.m2 = (float)auVar13._32_4_;
  left.m6 = (float)auVar13._36_4_;
  left.m10 = (float)auVar13._40_4_;
  left.m14 = (float)auVar13._44_4_;
  left.m3 = (float)auVar13._48_4_;
  left.m7 = (float)auVar13._52_4_;
  right.m8 = mat_rotation.m8;
  right.m12 = mat_rotation.m12;
  right.m0 = mat_rotation.m0;
  right.m4 = mat_rotation.m4;
  right.m1 = mat_rotation.m1;
  right.m5 = mat_rotation.m5;
  right.m9 = mat_rotation.m9;
  right.m13 = mat_rotation.m13;
  right.m2 = mat_rotation.m2;
  right.m6 = mat_rotation.m6;
  right.m10 = mat_rotation.m10;
  right.m14 = mat_rotation.m14;
  right.m3 = mat_rotation.m3;
  right.m7 = mat_rotation.m7;
  right.m11 = mat_rotation.m11;
  right.m15 = mat_rotation.m15;
  rf_mat_mul(left,right);
  lVar24 = position._0_8_ << 0x20;
  right_00.m14 = position.z;
  right_00.m10 = 1.0;
  left_00._8_8_ = uStack_e8;
  left_00._0_8_ = local_f0;
  left_00._16_8_ = local_e0;
  left_00._24_8_ = uStack_d8;
  left_00._32_8_ = local_d0;
  left_00._40_8_ = uStack_c8;
  left_00._48_8_ = local_c0;
  left_00._56_8_ = uStack_b8;
  right_00.m8 = (float)(int)lVar24;
  right_00.m12 = (float)(int)((ulong)lVar24 >> 0x20);
  right_00.m0 = 1.0;
  right_00.m4 = 0.0;
  right_00.m1 = 0.0;
  right_00.m5 = 1.0;
  right_00.m9 = (float)(int)((ulong)(uint)local_1d8._4_4_ << 0x20);
  right_00.m13 = (float)(int)(((ulong)(uint)local_1d8._4_4_ << 0x20) >> 0x20);
  right_00.m2 = 0.0;
  right_00.m6 = 0.0;
  right_00.m3 = 0.0;
  right_00.m7 = 0.0;
  right_00.m11 = 0.0;
  right_00.m15 = 1.0;
  rf_mat_mul(left_00,right_00);
  right_01._8_8_ = mat_transform._8_8_;
  right_01._0_8_ = mat_transform._0_8_;
  right_01._16_8_ = mat_transform._16_8_;
  right_01._24_8_ = mat_transform._24_8_;
  right_01._32_8_ = mat_transform._32_8_;
  right_01._40_8_ = mat_transform._40_8_;
  right_01._48_8_ = mat_transform._48_8_;
  right_01._56_8_ = mat_transform._56_8_;
  rf_mat_mul(model.transform,right_01);
  Var14 = CONCAT81(SUB158(ZEXT815(0),7),tint.a);
  auVar17._9_6_ = 0;
  auVar17._0_9_ = Var14;
  auVar15._1_10_ = SUB1510(auVar17 << 0x30,5);
  auVar15[0] = tint.b;
  auVar18._11_4_ = 0;
  auVar18._0_11_ = auVar15;
  auVar11[2] = tint.g;
  auVar11._0_2_ = tint._0_2_;
  auVar11._3_12_ = SUB1512(auVar18 << 0x20,3);
  auVar12._2_13_ = auVar11._2_13_;
  auVar12._0_2_ = tint._0_2_ & 0xff;
  uVar38 = (ushort)Var14;
  auVar8._10_2_ = 0;
  auVar8._0_10_ = auVar12._0_10_;
  auVar8._12_2_ = uVar38;
  uVar19 = CONCAT42(auVar8._10_4_,auVar15._0_2_);
  auVar16._6_8_ = 0;
  auVar16._0_6_ = uVar19;
  auVar9._4_2_ = auVar11._2_2_;
  auVar9._0_4_ = auVar12._0_4_;
  auVar9._6_8_ = SUB148(auVar16 << 0x40,6);
  auVar27._0_8_ = (double)(int)uVar19;
  auVar27._8_8_ = (double)uVar38;
  auVar35._0_8_ = (double)(auVar12._0_4_ & 0xffff);
  auVar35._8_8_ = (double)auVar9._4_4_;
  auVar35 = divpd(auVar35,_DAT_0016fec0);
  auVar27 = divpd(auVar27,_DAT_0016fec0);
  for (lVar24 = 0; lVar24 < model.mesh_count; lVar24 = lVar24 + 1) {
    rVar1 = (model.materials[model.mesh_material[lVar24]].maps)->color;
    auVar10[0xc] = rVar1.a;
    auVar10._0_12_ = ZEXT712(0);
    auVar36._0_8_ = (double)((uint)rVar1 & 0xff);
    auVar36._8_8_ = (double)((uint)rVar1 >> 8 & 0xff);
    auVar28._0_8_ = (double)(int)CONCAT32(auVar10._10_3_,(ushort)rVar1.b);
    auVar28._8_8_ = (double)rVar1.a;
    auVar28 = divpd(auVar28,_DAT_0016fec0);
    local_1c8 = auVar27._0_8_;
    dStack_1c0 = auVar27._8_8_;
    auVar36 = divpd(auVar36,_DAT_0016fec0);
    local_1d8 = auVar35._0_8_;
    dStack_1d0 = auVar35._8_8_;
    iVar31 = (int)(auVar36._0_8_ * local_1d8 * (double)DAT_0016fec0);
    iVar37 = (int)(auVar36._8_8_ * dStack_1d0 * DAT_0016fec0._8_8_);
    iVar26 = (int)(auVar28._0_8_ * local_1c8 * (double)DAT_0016fec0);
    iVar29 = (int)(auVar28._8_8_ * dStack_1c0 * DAT_0016fec0._8_8_);
    sVar6 = (short)iVar31;
    cVar2 = (0 < sVar6) * (sVar6 < 0x100) * (char)iVar31 - (0xff < sVar6);
    sVar6 = (short)((uint)iVar31 >> 0x10);
    sVar30 = CONCAT11((0 < sVar6) * (sVar6 < 0x100) * (char)((uint)iVar31 >> 0x10) - (0xff < sVar6),
                      cVar2);
    sVar6 = (short)iVar37;
    cVar3 = (0 < sVar6) * (sVar6 < 0x100) * (char)iVar37 - (0xff < sVar6);
    sVar6 = (short)((uint)iVar37 >> 0x10);
    uVar32 = CONCAT13((0 < sVar6) * (sVar6 < 0x100) * (char)((uint)iVar37 >> 0x10) - (0xff < sVar6),
                      CONCAT12(cVar3,sVar30));
    sVar6 = (short)iVar26;
    cVar4 = (0 < sVar6) * (sVar6 < 0x100) * (char)iVar26 - (0xff < sVar6);
    sVar6 = (short)((uint)iVar26 >> 0x10);
    uVar34 = CONCAT15((0 < sVar6) * (sVar6 < 0x100) * (char)((uint)iVar26 >> 0x10) - (0xff < sVar6),
                      CONCAT14(cVar4,uVar32));
    sVar6 = (short)iVar29;
    cVar5 = (0 < sVar6) * (sVar6 < 0x100) * (char)iVar29 - (0xff < sVar6);
    sVar7 = (short)((uint)iVar29 >> 0x10);
    sVar6 = (short)((uint)uVar32 >> 0x10);
    rVar33.g = (0 < sVar6) * (sVar6 < 0x100) * cVar3 - (0xff < sVar6);
    rVar33.r = (0 < sVar30) * (sVar30 < 0x100) * cVar2 - (0xff < sVar30);
    sVar6 = (short)((uint6)uVar34 >> 0x20);
    rVar33.b = (0 < sVar6) * (sVar6 < 0x100) * cVar4 - (0xff < sVar6);
    sVar6 = (short)(CONCAT17((0 < sVar7) * (sVar7 < 0x100) * (char)((uint)iVar29 >> 0x10) -
                             (0xff < sVar7),CONCAT16(cVar5,uVar34)) >> 0x30);
    rVar33.a = (0 < sVar6) * (sVar6 < 0x100) * cVar5 - (0xff < sVar6);
    (model.materials[model.mesh_material[lVar24]].maps)->color = rVar33;
    iVar26 = model.mesh_material[lVar24];
    prVar21 = model.meshes;
    puVar23 = (undefined8 *)&stack0xfffffffffffffcd8;
    for (lVar20 = 0xe; lVar20 != 0; lVar20 = lVar20 + -1) {
      *puVar23 = *(undefined8 *)prVar21;
      prVar21 = (rf_mesh *)((long)prVar21 + (ulong)bVar25 * -0x10 + 8);
      puVar23 = puVar23 + (ulong)bVar25 * -2 + 1;
    }
    prVar22 = model.materials + iVar26;
    puVar23 = (undefined8 *)&stack0xfffffffffffffd48;
    for (lVar20 = 0x13; lVar20 != 0; lVar20 = lVar20 + -1) {
      *puVar23 = *(undefined8 *)&prVar22->shader;
      prVar22 = (rf_material *)((long)prVar22 + (ulong)bVar25 * -0x10 + 8);
      puVar23 = puVar23 + (ulong)bVar25 * -2 + 1;
    }
    mesh.vertices = (float *)model.transform._8_8_;
    mesh.vertex_count = (int)model.transform.m0;
    mesh.triangle_count = (int)model.transform.m4;
    mesh.texcoords = (float *)model.transform._16_8_;
    mesh.texcoords2 = (float *)model.transform._24_8_;
    mesh.normals = (float *)model.transform._32_8_;
    mesh.tangents = (float *)model.transform._40_8_;
    mesh.colors = (uchar *)model.transform._48_8_;
    mesh.indices = (unsigned_short *)model.transform._56_8_;
    mesh.anim_vertices = (float *)mat_transform._0_8_;
    mesh.anim_normals = (float *)mat_transform._8_8_;
    mesh.bone_ids = (int *)mat_transform._16_8_;
    mesh.bone_weights = (float *)mat_transform._24_8_;
    mesh.vao_id = (uint)mat_transform.m2;
    mesh._100_4_ = mat_transform.m6;
    mesh.vbo_id = (uint *)mat_transform._40_8_;
    material.shader.locs[1] = (int)mat_transform.m11;
    material.shader.locs[2] = (int)mat_transform.m15;
    material.shader.id = (uint)mat_transform.m3;
    material.shader.locs[0] = (int)mat_transform.m7;
    material.shader.locs[3] = in_stack_fffffffffffffd58._0_4_;
    material.shader.locs[4] = in_stack_fffffffffffffd58._4_4_;
    material.shader.locs[5] = in_stack_fffffffffffffd58._8_4_;
    material.shader.locs[6] = in_stack_fffffffffffffd58._12_4_;
    material.shader.locs[7] = in_stack_fffffffffffffd58._16_4_;
    material.shader.locs[8] = in_stack_fffffffffffffd58._20_4_;
    material.shader.locs[9] = in_stack_fffffffffffffd58._24_4_;
    material.shader.locs[10] = in_stack_fffffffffffffd58._28_4_;
    material.shader.locs[0xb] = in_stack_fffffffffffffd58._32_4_;
    material.shader.locs[0xc] = in_stack_fffffffffffffd58._36_4_;
    material.shader.locs[0xd] = in_stack_fffffffffffffd58._40_4_;
    material.shader.locs[0xe] = in_stack_fffffffffffffd58._44_4_;
    material.shader.locs[0xf] = in_stack_fffffffffffffd58._48_4_;
    material.shader.locs[0x10] = in_stack_fffffffffffffd58._52_4_;
    material.shader.locs[0x11] = in_stack_fffffffffffffd58._56_4_;
    material.shader.locs[0x12] = in_stack_fffffffffffffd58._60_4_;
    material.shader.locs[0x13] = in_stack_fffffffffffffd58._64_4_;
    material.shader.locs[0x14] = in_stack_fffffffffffffd58._68_4_;
    material.shader.locs[0x15] = in_stack_fffffffffffffd58._72_4_;
    material.shader.locs[0x16] = in_stack_fffffffffffffd58._76_4_;
    material.shader.locs[0x17] = in_stack_fffffffffffffd58._80_4_;
    material.shader.locs[0x18] = in_stack_fffffffffffffd58._84_4_;
    material.shader.locs[0x19] = in_stack_fffffffffffffd58._88_4_;
    material.shader.locs[0x1a] = in_stack_fffffffffffffd58._92_4_;
    material.shader.locs[0x1b] = in_stack_fffffffffffffd58._96_4_;
    material.shader.locs[0x1c] = in_stack_fffffffffffffd58._100_4_;
    material.shader.locs[0x1d] = in_stack_fffffffffffffd58._104_4_;
    material.shader.locs[0x1e] = in_stack_fffffffffffffd58._108_4_;
    material.shader.locs[0x1f] = in_stack_fffffffffffffd58._112_4_;
    material._132_4_ = in_stack_fffffffffffffd58._116_4_;
    material.maps = (rf_material_map *)in_stack_fffffffffffffd58._120_8_;
    material.params = (float *)in_stack_fffffffffffffd58._128_8_;
    transform._8_8_ = uStack_128;
    transform._0_8_ = local_130;
    transform._16_8_ = local_120;
    transform._24_8_ = uStack_118;
    transform._32_8_ = local_110;
    transform._40_8_ = uStack_108;
    transform._48_8_ = local_100;
    transform._56_8_ = uStack_f8;
    rf_gfx_draw_mesh(mesh,material,transform);
    (model.materials[model.mesh_material[lVar24]].maps)->color = rVar1;
    model.meshes = model.meshes + 1;
  }
  return;
}

Assistant:

RF_API void rf_draw_model_ex(rf_model model, rf_vec3 position, rf_vec3 rotation_axis, float rotationAngle, rf_vec3 scale, rf_color tint)
{
    // Calculate transformation matrix from function parameters
    // Get transform matrix (rotation -> scale -> translation)
    rf_mat mat_scale = rf_mat_scale(scale.x, scale.y, scale.z);
    rf_mat mat_rotation = rf_mat_rotate(rotation_axis, rotationAngle * RF_DEG2RAD);
    rf_mat mat_translation = rf_mat_translate(position.x, position.y, position.z);

    rf_mat mat_transform = rf_mat_mul(rf_mat_mul(mat_scale, mat_rotation), mat_translation);

    // Combine model transformation matrix (model.transform) with matrix generated by function parameters (mat_transform)
    model.transform = rf_mat_mul(model.transform, mat_transform);

    for (rf_int i = 0; i < model.mesh_count; i++)
    {
        // TODO: Review color + tint premultiplication mechanism
        rf_color color = model.materials[model.mesh_material[i]].maps[RF_MAP_DIFFUSE].color;

        rf_color color_tint = RF_WHITE;
        color_tint.r = (((float)color.r/255.0)*((float)tint.r/255.0))*255;
        color_tint.g = (((float)color.g/255.0)*((float)tint.g/255.0))*255;
        color_tint.b = (((float)color.b/255.0)*((float)tint.b/255.0))*255;
        color_tint.a = (((float)color.a/255.0)*((float)tint.a/255.0))*255;

        model.materials[model.mesh_material[i]].maps[RF_MAP_DIFFUSE].color = color_tint;
        rf_gfx_draw_mesh(model.meshes[i], model.materials[model.mesh_material[i]], model.transform);
        model.materials[model.mesh_material[i]].maps[RF_MAP_DIFFUSE].color = color;
    }
}